

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

xmlChar * htmlParseHTMLAttribute(htmlParserCtxtPtr ctxt,xmlChar stop)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  htmlEntityDesc *phVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  byte *pbVar11;
  xmlChar *name;
  int l;
  byte *local_40;
  int local_34;
  
  local_40 = (byte *)0x0;
  pbVar3 = (byte *)(*xmlMallocAtomic)(100);
  if (pbVar3 == (byte *)0x0) {
    htmlErrMemory(ctxt,"buffer allocation failed\n");
LAB_0014fed0:
    pbVar11 = (byte *)0x0;
  }
  else {
    pbVar4 = ctxt->input->cur;
    bVar9 = *pbVar4;
    pbVar11 = pbVar3;
    if (bVar9 != stop && bVar9 != 0) {
      iVar10 = 100;
      while ((stop != '\0' || (bVar9 != 0x3e))) {
        pbVar6 = pbVar11;
        if (stop == '\0') {
          if (bVar9 < 0x27) {
            if ((ulong)bVar9 == 0x26) goto LAB_0014ff21;
            if ((0x100002600U >> ((ulong)bVar9 & 0x3f) & 1) != 0) break;
          }
LAB_0014fff3:
          if ((long)(iVar10 + -100) < (long)pbVar3 - (long)pbVar11) {
            iVar10 = iVar10 * 2;
            pbVar6 = (byte *)(*xmlRealloc)(pbVar11,(long)iVar10);
            if (pbVar6 == (byte *)0x0) goto LAB_00150218;
            pbVar3 = pbVar6 + (int)((long)pbVar3 - (long)pbVar11);
          }
          uVar2 = htmlCurrentChar(ctxt,&local_34);
          if (uVar2 < 0x80) {
            *pbVar3 = (byte)uVar2;
            pbVar3 = pbVar3 + 1;
          }
          else {
            if (uVar2 < 0x800) {
              bVar9 = (byte)(uVar2 >> 6) | 0xc0;
              uVar8 = 0;
            }
            else if (uVar2 < 0x10000) {
              bVar9 = (byte)(uVar2 >> 0xc) | 0xe0;
              uVar8 = 6;
            }
            else {
              bVar9 = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
              uVar8 = 0xc;
            }
            *pbVar3 = bVar9;
            pbVar3 = pbVar3 + 1;
            do {
              *pbVar3 = (byte)(uVar2 >> ((byte)uVar8 & 0x1f)) & 0x3f | 0x80;
              pbVar3 = pbVar3 + 1;
              bVar1 = 5 < uVar8;
              uVar8 = uVar8 - 6;
            } while (bVar1);
          }
          xmlNextChar(ctxt);
        }
        else {
          if (bVar9 != 0x26) goto LAB_0014fff3;
LAB_0014ff21:
          if (pbVar4[1] == 0x23) {
            uVar2 = htmlParseCharRef(ctxt);
            if (uVar2 < 0x80) {
              *pbVar3 = (byte)uVar2;
LAB_0015006e:
              pbVar3 = pbVar3 + 1;
            }
            else {
              if (uVar2 < 0x800) {
                bVar9 = (byte)(uVar2 >> 6) | 0xc0;
                uVar8 = 0;
              }
              else if (uVar2 < 0x10000) {
                bVar9 = (byte)(uVar2 >> 0xc) | 0xe0;
                uVar8 = 6;
              }
              else {
                bVar9 = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
                uVar8 = 0xc;
              }
              *pbVar3 = bVar9;
              pbVar3 = pbVar3 + 1;
              do {
                *pbVar3 = (byte)(uVar2 >> ((byte)uVar8 & 0x1f)) & 0x3f | 0x80;
                pbVar3 = pbVar3 + 1;
                bVar1 = 5 < uVar8;
                uVar8 = uVar8 - 6;
              } while (bVar1);
            }
            if ((long)pbVar3 - (long)pbVar11 <= (long)(iVar10 + -100)) goto LAB_001501dd;
            iVar10 = iVar10 * 2;
            pbVar6 = (byte *)(*xmlRealloc)(pbVar11,(long)iVar10);
            if (pbVar6 != (byte *)0x0) {
              pbVar3 = pbVar6 + (int)((long)pbVar3 - (long)pbVar11);
              goto LAB_001501dd;
            }
LAB_00150218:
            htmlErrMemory(ctxt,"growing buffer\n");
            (*xmlFree)(pbVar11);
            goto LAB_0014fed0;
          }
          phVar5 = htmlParseEntityRef(ctxt,&local_40);
          if (local_40 == (byte *)0x0) {
            *pbVar3 = 0x26;
            goto LAB_0015006e;
          }
          if (phVar5 == (htmlEntityDesc *)0x0) {
            *pbVar3 = 0x26;
            bVar9 = *local_40;
            pbVar4 = local_40;
            while (pbVar3 = pbVar3 + 1, bVar9 != 0) {
              pbVar7 = pbVar6;
              if ((long)(iVar10 + -100) < (long)pbVar3 - (long)pbVar6) {
                iVar10 = iVar10 * 2;
                pbVar7 = (byte *)(*xmlRealloc)(pbVar6,(long)iVar10);
                pbVar11 = pbVar6;
                if (pbVar7 == (byte *)0x0) goto LAB_00150218;
                pbVar3 = pbVar7 + (int)((long)pbVar3 - (long)pbVar6);
                bVar9 = *pbVar4;
              }
              *pbVar3 = bVar9;
              bVar9 = pbVar4[1];
              pbVar6 = pbVar7;
              pbVar4 = pbVar4 + 1;
            }
          }
          else {
            if ((long)(iVar10 + -100) < (long)pbVar3 - (long)pbVar11) {
              iVar10 = iVar10 * 2;
              pbVar6 = (byte *)(*xmlRealloc)(pbVar11,(long)iVar10);
              if (pbVar6 == (byte *)0x0) goto LAB_00150218;
              pbVar3 = pbVar6 + (int)((long)pbVar3 - (long)pbVar11);
            }
            uVar2 = phVar5->value;
            if (uVar2 < 0x80) {
              *pbVar3 = (byte)uVar2;
              pbVar3 = pbVar3 + 1;
            }
            else {
              if (uVar2 < 0x800) {
                bVar9 = (byte)(uVar2 >> 6) | 0xc0;
                uVar8 = 0;
              }
              else if (uVar2 < 0x10000) {
                bVar9 = (byte)(uVar2 >> 0xc) | 0xe0;
                uVar8 = 6;
              }
              else {
                bVar9 = (byte)(uVar2 >> 0x12) & 7 | 0xf0;
                uVar8 = 0xc;
              }
              *pbVar3 = bVar9;
              pbVar3 = pbVar3 + 1;
              do {
                *pbVar3 = (byte)(uVar2 >> ((byte)uVar8 & 0x1f)) & 0x3f | 0x80;
                pbVar3 = pbVar3 + 1;
                bVar1 = 5 < uVar8;
                uVar8 = uVar8 - 6;
              } while (bVar1);
            }
          }
        }
LAB_001501dd:
        pbVar4 = ctxt->input->cur;
        bVar9 = *pbVar4;
        pbVar11 = pbVar6;
        if ((bVar9 == 0) || (bVar9 == stop)) break;
      }
    }
    *pbVar3 = 0;
  }
  return pbVar11;
}

Assistant:

static xmlChar *
htmlParseHTMLAttribute(htmlParserCtxtPtr ctxt, const xmlChar stop) {
    xmlChar *buffer = NULL;
    int buffer_size = 0;
    xmlChar *out = NULL;
    const xmlChar *name = NULL;
    const xmlChar *cur = NULL;
    const htmlEntityDesc * ent;

    /*
     * allocate a translation buffer.
     */
    buffer_size = HTML_PARSER_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) {
	htmlErrMemory(ctxt, "buffer allocation failed\n");
	return(NULL);
    }
    out = buffer;

    /*
     * Ok loop until we reach one of the ending chars
     */
    while ((CUR != 0) && (CUR != stop)) {
	if ((stop == 0) && (CUR == '>')) break;
	if ((stop == 0) && (IS_BLANK_CH(CUR))) break;
        if (CUR == '&') {
	    if (NXT(1) == '#') {
		unsigned int c;
		int bits;

		c = htmlParseCharRef(ctxt);
		if      (c <    0x80)
		        { *out++  = c;                bits= -6; }
		else if (c <   0x800)
		        { *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
		else if (c < 0x10000)
		        { *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
		else
		        { *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

		for ( ; bits >= 0; bits-= 6) {
		    *out++  = ((c >> bits) & 0x3F) | 0x80;
		}

		if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		}
	    } else {
		ent = htmlParseEntityRef(ctxt, &name);
		if (name == NULL) {
		    *out++ = '&';
		    if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		    }
		} else if (ent == NULL) {
		    *out++ = '&';
		    cur = name;
		    while (*cur != 0) {
			if (out - buffer > buffer_size - 100) {
			    int indx = out - buffer;

			    growBuffer(buffer);
			    out = &buffer[indx];
			}
			*out++ = *cur++;
		    }
		} else {
		    unsigned int c;
		    int bits;

		    if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		    }
		    c = ent->value;
		    if      (c <    0x80)
			{ *out++  = c;                bits= -6; }
		    else if (c <   0x800)
			{ *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
		    else if (c < 0x10000)
			{ *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
		    else
			{ *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

		    for ( ; bits >= 0; bits-= 6) {
			*out++  = ((c >> bits) & 0x3F) | 0x80;
		    }
		}
	    }
	} else {
	    unsigned int c;
	    int bits, l;

	    if (out - buffer > buffer_size - 100) {
		int indx = out - buffer;

		growBuffer(buffer);
		out = &buffer[indx];
	    }
	    c = CUR_CHAR(l);
	    if      (c <    0x80)
		    { *out++  = c;                bits= -6; }
	    else if (c <   0x800)
		    { *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
	    else if (c < 0x10000)
		    { *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
	    else
		    { *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

	    for ( ; bits >= 0; bits-= 6) {
		*out++  = ((c >> bits) & 0x3F) | 0x80;
	    }
	    NEXT;
	}
    }
    *out = 0;
    return(buffer);
}